

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

bool __thiscall QXmlStreamReaderPrivate::scanAttType(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  short tokenToInject;
  uint uVar4;
  char **ppcVar5;
  
  lVar1 = (this->putStack).tos;
  if (lVar1 == -1) {
    if (this->readBufferPos < (this->readBuffer).d.size) {
      uVar4 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
    }
    else {
      uVar4 = getChar_helper(this);
      if (uVar4 == 0xffffffff) {
        uVar4 = 0xffffffff;
      }
      else {
        this->readBufferPos = this->readBufferPos + -1;
      }
    }
  }
  else {
    uVar4 = (this->putStack).data[lVar1];
  }
  bVar3 = false;
  if ((int)uVar4 < 0x49) {
    if (uVar4 == 0x43) {
      ppcVar5 = QXmlStreamGrammar::spell + 0x2f;
      tokenToInject = 0x2f;
LAB_0039cbcd:
      bVar3 = scanString(this,*ppcVar5,tokenToInject,true);
      return bVar3;
    }
    bVar3 = false;
    if (uVar4 == 0x45) {
      bVar2 = scanString(this,"ENTITY",0x20,true);
      bVar3 = true;
      if (!bVar2) {
        ppcVar5 = QXmlStreamGrammar::spell + 0x33;
        tokenToInject = 0x33;
        goto LAB_0039cbcd;
      }
    }
  }
  else if (uVar4 == 0x4e) {
    bVar2 = scanString(this,"NOTATION",0x21,true);
    bVar3 = true;
    if (!bVar2) {
      bVar2 = scanString(this,"NMTOKEN",0x34,true);
      if (!bVar2) {
        ppcVar5 = QXmlStreamGrammar::spell + 0x35;
        tokenToInject = 0x35;
        goto LAB_0039cbcd;
      }
    }
  }
  else if (uVar4 == 0x49) {
    bVar2 = scanString(this,"ID",0x30,true);
    bVar3 = true;
    if (!bVar2) {
      bVar2 = scanString(this,"IDREF",0x31,true);
      if (!bVar2) {
        ppcVar5 = QXmlStreamGrammar::spell + 0x32;
        tokenToInject = 0x32;
        goto LAB_0039cbcd;
      }
    }
  }
  return bVar3;
}

Assistant:

bool QXmlStreamReaderPrivate::scanAttType()
{
    switch (peekChar()) {
    case 'C':
        return scanString(spell[CDATA], CDATA);
    case 'I':
        if (scanString(spell[ID], ID))
            return true;
        if (scanString(spell[IDREF], IDREF))
            return true;
        return scanString(spell[IDREFS], IDREFS);
    case 'E':
        if (scanString(spell[ENTITY], ENTITY))
            return true;
        return scanString(spell[ENTITIES], ENTITIES);
    case 'N':
        if (scanString(spell[NOTATION], NOTATION))
            return true;
        if (scanString(spell[NMTOKEN], NMTOKEN))
            return true;
        return scanString(spell[NMTOKENS], NMTOKENS);
    default:
        ;
    }
    return false;
}